

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_1,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::TriangleMIntersectorKMoeller<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  Geometry *pGVar1;
  RTCFilterFunctionN p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ushort uVar24;
  undefined1 (*pauVar25) [64];
  long lVar26;
  uint uVar27;
  uint uVar28;
  undefined4 uVar29;
  ulong uVar30;
  NodeRef root;
  ulong *puVar31;
  bool bVar32;
  ulong uVar33;
  int iVar34;
  undefined1 auVar35 [16];
  int iVar56;
  int iVar57;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  int iVar58;
  int iVar70;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar71 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM20 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  TravRayK<16,_false> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  Precalculations local_a7e9;
  RayQueryContext *local_a7e8;
  size_t local_a7e0;
  uint local_a7d8;
  uint local_a7d4;
  RayK<16> *local_a7d0;
  BVH *local_a7c8;
  Intersectors *local_a7c0;
  ulong local_a7b8;
  RTCFilterFunctionNArguments local_a7b0;
  undefined1 local_a780 [64];
  undefined1 local_a740 [64];
  int local_a700;
  int iStack_a6fc;
  int iStack_a6f8;
  int iStack_a6f4;
  int iStack_a6f0;
  int iStack_a6ec;
  int iStack_a6e8;
  int iStack_a6e4;
  int iStack_a6e0;
  int iStack_a6dc;
  int iStack_a6d8;
  int iStack_a6d4;
  int iStack_a6d0;
  int iStack_a6cc;
  int iStack_a6c8;
  int iStack_a6c4;
  undefined1 local_a6c0 [64];
  undefined1 local_a680 [64];
  undefined1 local_a640 [64];
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a500;
  undefined1 local_a440 [64];
  undefined1 local_a400 [64];
  undefined1 local_a3c0 [64];
  undefined1 local_a380 [64];
  undefined1 local_a340 [64];
  undefined1 local_a300 [64];
  undefined1 local_a2c0 [64];
  undefined1 local_a280 [64];
  undefined1 local_a240 [64];
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  uint local_a140;
  uint uStack_a13c;
  uint uStack_a138;
  uint uStack_a134;
  uint uStack_a130;
  uint uStack_a12c;
  uint uStack_a128;
  uint uStack_a124;
  uint uStack_a120;
  uint uStack_a11c;
  uint uStack_a118;
  uint uStack_a114;
  uint uStack_a110;
  uint uStack_a10c;
  uint uStack_a108;
  uint uStack_a104;
  uint local_a100;
  uint uStack_a0fc;
  uint uStack_a0f8;
  uint uStack_a0f4;
  uint uStack_a0f0;
  uint uStack_a0ec;
  uint uStack_a0e8;
  uint uStack_a0e4;
  uint uStack_a0e0;
  uint uStack_a0dc;
  uint uStack_a0d8;
  uint uStack_a0d4;
  uint uStack_a0d0;
  uint uStack_a0cc;
  uint uStack_a0c8;
  uint uStack_a0c4;
  undefined8 local_a0c0;
  undefined8 uStack_a0b8;
  undefined8 uStack_a0b0;
  undefined8 uStack_a0a8;
  undefined8 uStack_a0a0;
  undefined8 uStack_a098;
  undefined8 uStack_a090;
  undefined8 uStack_a088;
  undefined8 local_a080;
  undefined8 uStack_a078;
  undefined8 uStack_a070;
  undefined8 uStack_a068;
  undefined8 uStack_a060;
  undefined8 uStack_a058;
  undefined8 uStack_a050;
  undefined8 uStack_a048;
  undefined8 local_a040;
  undefined8 uStack_a038;
  undefined8 uStack_a030;
  undefined8 uStack_a028;
  undefined8 uStack_a020;
  undefined8 uStack_a018;
  undefined8 uStack_a010;
  undefined8 uStack_a008;
  undefined1 local_a000 [64];
  undefined1 local_9fc0 [64];
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  undefined1 local_9f00 [64];
  undefined1 local_9ec0 [64];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  
  local_a7c8 = (BVH *)This->ptr;
  local_9e48 = (local_a7c8->root).ptr;
  if (local_9e48 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar36 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
      auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar33 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar71,5);
      uVar30 = vpcmpeqd_avx512f(auVar36,(undefined1  [64])valid_i->field_0);
      uVar33 = uVar33 & uVar30;
      if ((ushort)uVar33 != 0) {
        local_a500.field_0.x.field_0 = (vfloat_impl<16>)*(undefined1 (*) [64])ray;
        local_a500.field_0.y.field_0 = (vfloat_impl<16>)*(undefined1 (*) [64])(ray + 0x40);
        local_a500.field_0.z.field_0 = (vfloat_impl<16>)*(undefined1 (*) [64])(ray + 0x80);
        local_a440 = *(undefined1 (*) [64])(ray + 0x100);
        local_a400 = *(undefined1 (*) [64])(ray + 0x140);
        local_a3c0 = *(undefined1 (*) [64])(ray + 0x180);
        auVar36 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
        auVar37 = vandps_avx512dq(local_a440,auVar36);
        auVar38 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
        uVar30 = vcmpps_avx512f(auVar37,auVar38,1);
        bVar32 = (bool)((byte)uVar30 & 1);
        iVar34 = auVar38._0_4_;
        auVar37._0_4_ = (uint)bVar32 * iVar34 | (uint)!bVar32 * local_a440._0_4_;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        iVar56 = auVar38._4_4_;
        auVar37._4_4_ = (uint)bVar32 * iVar56 | (uint)!bVar32 * local_a440._4_4_;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        iVar57 = auVar38._8_4_;
        auVar37._8_4_ = (uint)bVar32 * iVar57 | (uint)!bVar32 * local_a440._8_4_;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        iVar58 = auVar38._12_4_;
        auVar37._12_4_ = (uint)bVar32 * iVar58 | (uint)!bVar32 * local_a440._12_4_;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        iVar59 = auVar38._16_4_;
        auVar37._16_4_ = (uint)bVar32 * iVar59 | (uint)!bVar32 * local_a440._16_4_;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        iVar60 = auVar38._20_4_;
        auVar37._20_4_ = (uint)bVar32 * iVar60 | (uint)!bVar32 * local_a440._20_4_;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        iVar61 = auVar38._24_4_;
        auVar37._24_4_ = (uint)bVar32 * iVar61 | (uint)!bVar32 * local_a440._24_4_;
        bVar32 = (bool)((byte)(uVar30 >> 7) & 1);
        iVar62 = auVar38._28_4_;
        auVar37._28_4_ = (uint)bVar32 * iVar62 | (uint)!bVar32 * local_a440._28_4_;
        bVar32 = (bool)((byte)(uVar30 >> 8) & 1);
        iVar63 = auVar38._32_4_;
        auVar37._32_4_ = (uint)bVar32 * iVar63 | (uint)!bVar32 * local_a440._32_4_;
        bVar32 = (bool)((byte)(uVar30 >> 9) & 1);
        iVar64 = auVar38._36_4_;
        auVar37._36_4_ = (uint)bVar32 * iVar64 | (uint)!bVar32 * local_a440._36_4_;
        bVar32 = (bool)((byte)(uVar30 >> 10) & 1);
        iVar65 = auVar38._40_4_;
        auVar37._40_4_ = (uint)bVar32 * iVar65 | (uint)!bVar32 * local_a440._40_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xb) & 1);
        iVar66 = auVar38._44_4_;
        auVar37._44_4_ = (uint)bVar32 * iVar66 | (uint)!bVar32 * local_a440._44_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xc) & 1);
        iVar67 = auVar38._48_4_;
        auVar37._48_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * local_a440._48_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xd) & 1);
        iVar68 = auVar38._52_4_;
        auVar37._52_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * local_a440._52_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xe) & 1);
        iVar69 = auVar38._56_4_;
        iVar70 = auVar38._60_4_;
        auVar37._56_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * local_a440._56_4_;
        bVar32 = SUB81(uVar30 >> 0xf,0);
        auVar37._60_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * local_a440._60_4_;
        auVar39 = vandps_avx512dq(local_a400,auVar36);
        uVar30 = vcmpps_avx512f(auVar39,auVar38,1);
        bVar32 = (bool)((byte)uVar30 & 1);
        auVar39._0_4_ = (uint)bVar32 * iVar34 | (uint)!bVar32 * local_a400._0_4_;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar32 * iVar56 | (uint)!bVar32 * local_a400._4_4_;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar32 * iVar57 | (uint)!bVar32 * local_a400._8_4_;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar32 * iVar58 | (uint)!bVar32 * local_a400._12_4_;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar39._16_4_ = (uint)bVar32 * iVar59 | (uint)!bVar32 * local_a400._16_4_;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar39._20_4_ = (uint)bVar32 * iVar60 | (uint)!bVar32 * local_a400._20_4_;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar39._24_4_ = (uint)bVar32 * iVar61 | (uint)!bVar32 * local_a400._24_4_;
        bVar32 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar39._28_4_ = (uint)bVar32 * iVar62 | (uint)!bVar32 * local_a400._28_4_;
        bVar32 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar39._32_4_ = (uint)bVar32 * iVar63 | (uint)!bVar32 * local_a400._32_4_;
        bVar32 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar39._36_4_ = (uint)bVar32 * iVar64 | (uint)!bVar32 * local_a400._36_4_;
        bVar32 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar39._40_4_ = (uint)bVar32 * iVar65 | (uint)!bVar32 * local_a400._40_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar39._44_4_ = (uint)bVar32 * iVar66 | (uint)!bVar32 * local_a400._44_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar39._48_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * local_a400._48_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar39._52_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * local_a400._52_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar39._56_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * local_a400._56_4_;
        bVar32 = SUB81(uVar30 >> 0xf,0);
        auVar39._60_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * local_a400._60_4_;
        auVar36 = vandps_avx512dq(local_a3c0,auVar36);
        uVar30 = vcmpps_avx512f(auVar36,auVar38,1);
        auVar36 = vrcp14ps_avx512f(auVar37);
        bVar32 = (bool)((byte)uVar30 & 1);
        auVar38._0_4_ = (uint)bVar32 * iVar34 | (uint)!bVar32 * local_a3c0._0_4_;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar32 * iVar56 | (uint)!bVar32 * local_a3c0._4_4_;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar32 * iVar57 | (uint)!bVar32 * local_a3c0._8_4_;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar32 * iVar58 | (uint)!bVar32 * local_a3c0._12_4_;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar32 * iVar59 | (uint)!bVar32 * local_a3c0._16_4_;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar32 * iVar60 | (uint)!bVar32 * local_a3c0._20_4_;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar32 * iVar61 | (uint)!bVar32 * local_a3c0._24_4_;
        bVar32 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar38._28_4_ = (uint)bVar32 * iVar62 | (uint)!bVar32 * local_a3c0._28_4_;
        bVar32 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar38._32_4_ = (uint)bVar32 * iVar63 | (uint)!bVar32 * local_a3c0._32_4_;
        bVar32 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar38._36_4_ = (uint)bVar32 * iVar64 | (uint)!bVar32 * local_a3c0._36_4_;
        bVar32 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar38._40_4_ = (uint)bVar32 * iVar65 | (uint)!bVar32 * local_a3c0._40_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar38._44_4_ = (uint)bVar32 * iVar66 | (uint)!bVar32 * local_a3c0._44_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar38._48_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * local_a3c0._48_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar38._52_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * local_a3c0._52_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar38._56_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * local_a3c0._56_4_;
        bVar32 = SUB81(uVar30 >> 0xf,0);
        auVar38._60_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * local_a3c0._60_4_;
        auVar40 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar41 = vrcp14ps_avx512f(auVar39);
        auVar37 = vfnmadd213ps_avx512f(auVar37,auVar36,auVar40);
        local_a380 = vfmadd132ps_avx512f(auVar37,auVar36,auVar36);
        auVar36 = vfnmadd213ps_avx512f(auVar39,auVar41,auVar40);
        auVar37 = vrcp14ps_avx512f(auVar38);
        local_a340 = vfmadd132ps_avx512f(auVar36,auVar41,auVar41);
        auVar36 = vfnmadd213ps_avx512f(auVar38,auVar37,auVar40);
        local_a300 = vfmadd132ps_avx512f(auVar36,auVar37,auVar37);
        local_a2c0 = vmulps_avx512f((undefined1  [64])local_a500.field_0.x.field_0,local_a380);
        local_a280 = vmulps_avx512f((undefined1  [64])local_a500.field_0.y.field_0,local_a340);
        local_a240 = vmulps_avx512f((undefined1  [64])local_a500.field_0.z.field_0,local_a300);
        uVar30 = vcmpps_avx512f(local_a380,auVar71,1);
        auVar36 = vpbroadcastd_avx512f(ZEXT416(0x20));
        auVar40._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar36._4_4_;
        auVar40._0_4_ = (uint)((byte)uVar30 & 1) * auVar36._0_4_;
        auVar40._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar36._8_4_;
        auVar40._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar36._12_4_;
        auVar40._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar36._16_4_;
        auVar40._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar36._20_4_;
        auVar40._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar36._24_4_;
        auVar40._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar36._28_4_;
        auVar40._32_4_ = (uint)((byte)(uVar30 >> 8) & 1) * auVar36._32_4_;
        auVar40._36_4_ = (uint)((byte)(uVar30 >> 9) & 1) * auVar36._36_4_;
        auVar40._40_4_ = (uint)((byte)(uVar30 >> 10) & 1) * auVar36._40_4_;
        auVar40._44_4_ = (uint)((byte)(uVar30 >> 0xb) & 1) * auVar36._44_4_;
        auVar40._48_4_ = (uint)((byte)(uVar30 >> 0xc) & 1) * auVar36._48_4_;
        auVar40._52_4_ = (uint)((byte)(uVar30 >> 0xd) & 1) * auVar36._52_4_;
        auVar40._56_4_ = (uint)((byte)(uVar30 >> 0xe) & 1) * auVar36._56_4_;
        auVar40._60_4_ = (uint)(byte)(uVar30 >> 0xf) * auVar36._60_4_;
        local_a200 = vmovdqa64_avx512f(auVar40);
        uVar30 = vcmpps_avx512f(local_a340,auVar71,5);
        auVar36 = vpbroadcastd_avx512f(ZEXT416(0x60));
        auVar37 = vpbroadcastd_avx512f(ZEXT416(0x40));
        bVar32 = (bool)((byte)uVar30 & 1);
        auVar41._0_4_ = (uint)bVar32 * auVar37._0_4_ | (uint)!bVar32 * auVar36._0_4_;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar32 * auVar37._4_4_ | (uint)!bVar32 * auVar36._4_4_;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar32 * auVar37._8_4_ | (uint)!bVar32 * auVar36._8_4_;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar32 * auVar37._12_4_ | (uint)!bVar32 * auVar36._12_4_;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar32 * auVar37._16_4_ | (uint)!bVar32 * auVar36._16_4_;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar32 * auVar37._20_4_ | (uint)!bVar32 * auVar36._20_4_;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar32 * auVar37._24_4_ | (uint)!bVar32 * auVar36._24_4_;
        bVar32 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar41._28_4_ = (uint)bVar32 * auVar37._28_4_ | (uint)!bVar32 * auVar36._28_4_;
        bVar32 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar41._32_4_ = (uint)bVar32 * auVar37._32_4_ | (uint)!bVar32 * auVar36._32_4_;
        bVar32 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar41._36_4_ = (uint)bVar32 * auVar37._36_4_ | (uint)!bVar32 * auVar36._36_4_;
        bVar32 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar41._40_4_ = (uint)bVar32 * auVar37._40_4_ | (uint)!bVar32 * auVar36._40_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar41._44_4_ = (uint)bVar32 * auVar37._44_4_ | (uint)!bVar32 * auVar36._44_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar41._48_4_ = (uint)bVar32 * auVar37._48_4_ | (uint)!bVar32 * auVar36._48_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar41._52_4_ = (uint)bVar32 * auVar37._52_4_ | (uint)!bVar32 * auVar36._52_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar41._56_4_ = (uint)bVar32 * auVar37._56_4_ | (uint)!bVar32 * auVar36._56_4_;
        bVar32 = SUB81(uVar30 >> 0xf,0);
        auVar41._60_4_ = (uint)bVar32 * auVar37._60_4_ | (uint)!bVar32 * auVar36._60_4_;
        local_a1c0 = vmovdqa64_avx512f(auVar41);
        uVar30 = vcmpps_avx512f(local_a300,auVar71,5);
        auVar36 = vpbroadcastd_avx512f(ZEXT416(0xa0));
        auVar37 = vpbroadcastd_avx512f(ZEXT416(0x80));
        bVar32 = (bool)((byte)uVar30 & 1);
        auVar42._0_4_ = (uint)bVar32 * auVar37._0_4_ | (uint)!bVar32 * auVar36._0_4_;
        bVar32 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar32 * auVar37._4_4_ | (uint)!bVar32 * auVar36._4_4_;
        bVar32 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar32 * auVar37._8_4_ | (uint)!bVar32 * auVar36._8_4_;
        bVar32 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar32 * auVar37._12_4_ | (uint)!bVar32 * auVar36._12_4_;
        bVar32 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar32 * auVar37._16_4_ | (uint)!bVar32 * auVar36._16_4_;
        bVar32 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar32 * auVar37._20_4_ | (uint)!bVar32 * auVar36._20_4_;
        bVar32 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar32 * auVar37._24_4_ | (uint)!bVar32 * auVar36._24_4_;
        bVar32 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar42._28_4_ = (uint)bVar32 * auVar37._28_4_ | (uint)!bVar32 * auVar36._28_4_;
        bVar32 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar42._32_4_ = (uint)bVar32 * auVar37._32_4_ | (uint)!bVar32 * auVar36._32_4_;
        bVar32 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar42._36_4_ = (uint)bVar32 * auVar37._36_4_ | (uint)!bVar32 * auVar36._36_4_;
        bVar32 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar42._40_4_ = (uint)bVar32 * auVar37._40_4_ | (uint)!bVar32 * auVar36._40_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar42._44_4_ = (uint)bVar32 * auVar37._44_4_ | (uint)!bVar32 * auVar36._44_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar42._48_4_ = (uint)bVar32 * auVar37._48_4_ | (uint)!bVar32 * auVar36._48_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar42._52_4_ = (uint)bVar32 * auVar37._52_4_ | (uint)!bVar32 * auVar36._52_4_;
        bVar32 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar42._56_4_ = (uint)bVar32 * auVar37._56_4_ | (uint)!bVar32 * auVar36._56_4_;
        bVar32 = SUB81(uVar30 >> 0xf,0);
        auVar42._60_4_ = (uint)bVar32 * auVar37._60_4_ | (uint)!bVar32 * auVar36._60_4_;
        local_a180 = vmovdqa64_avx512f(auVar42);
        auVar37 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        auVar36 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar71);
        bVar32 = (bool)((byte)uVar33 & 1);
        local_a140 = (uint)bVar32 * auVar36._0_4_ | (uint)!bVar32 * auVar37._0_4_;
        bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
        uStack_a13c = (uint)bVar32 * auVar36._4_4_ | (uint)!bVar32 * auVar37._4_4_;
        bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
        uStack_a138 = (uint)bVar32 * auVar36._8_4_ | (uint)!bVar32 * auVar37._8_4_;
        bVar32 = (bool)((byte)(uVar33 >> 3) & 1);
        uStack_a134 = (uint)bVar32 * auVar36._12_4_ | (uint)!bVar32 * auVar37._12_4_;
        bVar32 = (bool)((byte)(uVar33 >> 4) & 1);
        uStack_a130 = (uint)bVar32 * auVar36._16_4_ | (uint)!bVar32 * auVar37._16_4_;
        bVar32 = (bool)((byte)(uVar33 >> 5) & 1);
        uStack_a12c = (uint)bVar32 * auVar36._20_4_ | (uint)!bVar32 * auVar37._20_4_;
        bVar32 = (bool)((byte)(uVar33 >> 6) & 1);
        uStack_a128 = (uint)bVar32 * auVar36._24_4_ | (uint)!bVar32 * auVar37._24_4_;
        bVar32 = (bool)((byte)(uVar33 >> 7) & 1);
        uStack_a124 = (uint)bVar32 * auVar36._28_4_ | (uint)!bVar32 * auVar37._28_4_;
        bVar10 = (byte)(uVar33 >> 8);
        bVar32 = (bool)(bVar10 & 1);
        uStack_a120 = (uint)bVar32 * auVar36._32_4_ | (uint)!bVar32 * auVar37._32_4_;
        bVar32 = (bool)((byte)(uVar33 >> 9) & 1);
        uStack_a11c = (uint)bVar32 * auVar36._36_4_ | (uint)!bVar32 * auVar37._36_4_;
        bVar32 = (bool)((byte)(uVar33 >> 10) & 1);
        uStack_a118 = (uint)bVar32 * auVar36._40_4_ | (uint)!bVar32 * auVar37._40_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xb) & 1);
        uStack_a114 = (uint)bVar32 * auVar36._44_4_ | (uint)!bVar32 * auVar37._44_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xc) & 1);
        uStack_a110 = (uint)bVar32 * auVar36._48_4_ | (uint)!bVar32 * auVar37._48_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xd) & 1);
        uStack_a10c = (uint)bVar32 * auVar36._52_4_ | (uint)!bVar32 * auVar37._52_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xe) & 1);
        uStack_a108 = (uint)bVar32 * auVar36._56_4_ | (uint)!bVar32 * auVar37._56_4_;
        bVar32 = SUB81(uVar33 >> 0xf,0);
        uStack_a104 = (uint)bVar32 * auVar36._60_4_ | (uint)!bVar32 * auVar37._60_4_;
        auVar36 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        local_a7d8 = (uint)uVar33;
        auVar71 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar71);
        bVar32 = (bool)((byte)uVar33 & 1);
        local_a100 = (uint)bVar32 * auVar71._0_4_ | (uint)!bVar32 * auVar36._0_4_;
        bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
        uStack_a0fc = (uint)bVar32 * auVar71._4_4_ | (uint)!bVar32 * auVar36._4_4_;
        bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
        uStack_a0f8 = (uint)bVar32 * auVar71._8_4_ | (uint)!bVar32 * auVar36._8_4_;
        bVar32 = (bool)((byte)(uVar33 >> 3) & 1);
        uStack_a0f4 = (uint)bVar32 * auVar71._12_4_ | (uint)!bVar32 * auVar36._12_4_;
        bVar32 = (bool)((byte)(uVar33 >> 4) & 1);
        uStack_a0f0 = (uint)bVar32 * auVar71._16_4_ | (uint)!bVar32 * auVar36._16_4_;
        bVar32 = (bool)((byte)(uVar33 >> 5) & 1);
        uStack_a0ec = (uint)bVar32 * auVar71._20_4_ | (uint)!bVar32 * auVar36._20_4_;
        bVar32 = (bool)((byte)(uVar33 >> 6) & 1);
        uStack_a0e8 = (uint)bVar32 * auVar71._24_4_ | (uint)!bVar32 * auVar36._24_4_;
        bVar32 = (bool)((byte)(uVar33 >> 7) & 1);
        uStack_a0e4 = (uint)bVar32 * auVar71._28_4_ | (uint)!bVar32 * auVar36._28_4_;
        bVar32 = (bool)(bVar10 & 1);
        uStack_a0e0 = (uint)bVar32 * auVar71._32_4_ | (uint)!bVar32 * auVar36._32_4_;
        bVar32 = (bool)((byte)(uVar33 >> 9) & 1);
        uStack_a0dc = (uint)bVar32 * auVar71._36_4_ | (uint)!bVar32 * auVar36._36_4_;
        bVar32 = (bool)((byte)(uVar33 >> 10) & 1);
        uStack_a0d8 = (uint)bVar32 * auVar71._40_4_ | (uint)!bVar32 * auVar36._40_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xb) & 1);
        uStack_a0d4 = (uint)bVar32 * auVar71._44_4_ | (uint)!bVar32 * auVar36._44_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xc) & 1);
        uStack_a0d0 = (uint)bVar32 * auVar71._48_4_ | (uint)!bVar32 * auVar36._48_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xd) & 1);
        uStack_a0cc = (uint)bVar32 * auVar71._52_4_ | (uint)!bVar32 * auVar36._52_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xe) & 1);
        uStack_a0c8 = (uint)bVar32 * auVar71._56_4_ | (uint)!bVar32 * auVar36._56_4_;
        bVar32 = SUB81(uVar33 >> 0xf,0);
        uStack_a0c4 = (uint)bVar32 * auVar71._60_4_ | (uint)!bVar32 * auVar36._60_4_;
        uVar27 = (uint)(ushort)~(ushort)uVar33;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar28 = 0xe;
        }
        else {
          uVar28 = 2;
          if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)
          {
            uVar28 = 0xe;
          }
        }
        local_a7d0 = ray + 0x200;
        puVar31 = local_9e40;
        local_9e50 = 0xfffffffffffffff8;
        pauVar25 = (undefined1 (*) [64])local_8c40;
        local_8c80 = local_a140;
        uStack_8c7c = uStack_a13c;
        uStack_8c78 = uStack_a138;
        uStack_8c74 = uStack_a134;
        uStack_8c70 = uStack_a130;
        uStack_8c6c = uStack_a12c;
        uStack_8c68 = uStack_a128;
        uStack_8c64 = uStack_a124;
        uStack_8c60 = uStack_a120;
        uStack_8c5c = uStack_a11c;
        uStack_8c58 = uStack_a118;
        uStack_8c54 = uStack_a114;
        uStack_8c50 = uStack_a110;
        uStack_8c4c = uStack_a10c;
        uStack_8c48 = uStack_a108;
        uStack_8c44 = uStack_a104;
        auVar36 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
        auVar35 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar71 = ZEXT1664(auVar35);
        local_a7e8 = context;
        local_a7c0 = This;
        local_8cc0 = auVar37;
LAB_01f5d91d:
        do {
          do {
            root.ptr = puVar31[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01f5e1ab;
            puVar31 = puVar31 + -1;
            pauVar25 = pauVar25 + -1;
            auVar38 = *pauVar25;
            auVar43._4_4_ = uStack_a0fc;
            auVar43._0_4_ = local_a100;
            auVar43._8_4_ = uStack_a0f8;
            auVar43._12_4_ = uStack_a0f4;
            auVar43._16_4_ = uStack_a0f0;
            auVar43._20_4_ = uStack_a0ec;
            auVar43._24_4_ = uStack_a0e8;
            auVar43._28_4_ = uStack_a0e4;
            auVar43._32_4_ = uStack_a0e0;
            auVar43._36_4_ = uStack_a0dc;
            auVar43._40_4_ = uStack_a0d8;
            auVar43._44_4_ = uStack_a0d4;
            auVar43._48_4_ = uStack_a0d0;
            auVar43._52_4_ = uStack_a0cc;
            auVar43._56_4_ = uStack_a0c8;
            auVar43._60_4_ = uStack_a0c4;
            uVar33 = vcmpps_avx512f(auVar38,auVar43,1);
          } while ((short)uVar33 == 0);
          uVar29 = (undefined4)uVar33;
          if (uVar28 < (uint)POPCOUNT(uVar29)) {
LAB_01f5d961:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01f5e1ab;
                auVar44._4_4_ = uStack_a0fc;
                auVar44._0_4_ = local_a100;
                auVar44._8_4_ = uStack_a0f8;
                auVar44._12_4_ = uStack_a0f4;
                auVar44._16_4_ = uStack_a0f0;
                auVar44._20_4_ = uStack_a0ec;
                auVar44._24_4_ = uStack_a0e8;
                auVar44._28_4_ = uStack_a0e4;
                auVar44._32_4_ = uStack_a0e0;
                auVar44._36_4_ = uStack_a0dc;
                auVar44._40_4_ = uStack_a0d8;
                auVar44._44_4_ = uStack_a0d4;
                auVar44._48_4_ = uStack_a0d0;
                auVar44._52_4_ = uStack_a0cc;
                auVar44._56_4_ = uStack_a0c8;
                auVar44._60_4_ = uStack_a0c4;
                uVar19 = vcmpps_avx512f(auVar38,auVar44,9);
                if ((short)uVar19 == 0) goto LAB_01f5d91d;
                local_a7b8 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar22 = uVar27;
                if (local_a7b8 == 0) goto LAB_01f5e094;
                uVar22 = ~uVar27;
                lVar26 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
                uVar33 = 0;
                goto LAB_01f5db36;
              }
              uVar33 = 8;
              lVar26 = 0;
              auVar38 = auVar37;
              do {
                uVar30 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar26 * 8);
                if (uVar30 == 8) break;
                auVar39 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x40 + lVar26 * 4)));
                auVar39 = vfmsub132ps_avx512f(auVar39,local_a2c0,local_a380);
                auVar40 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x80 + lVar26 * 4)));
                auVar41 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xc0 + lVar26 * 4)));
                auVar40 = vfmsub132ps_avx512f(auVar40,local_a280,local_a340);
                auVar41 = vfmsub132ps_avx512f(auVar41,local_a240,local_a300);
                uVar29 = *(undefined4 *)(root.ptr + 0x60 + lVar26 * 4);
                auVar47._4_4_ = uVar29;
                auVar47._0_4_ = uVar29;
                auVar47._8_4_ = uVar29;
                auVar47._12_4_ = uVar29;
                auVar47._16_4_ = uVar29;
                auVar47._20_4_ = uVar29;
                auVar47._24_4_ = uVar29;
                auVar47._28_4_ = uVar29;
                auVar47._32_4_ = uVar29;
                auVar47._36_4_ = uVar29;
                auVar47._40_4_ = uVar29;
                auVar47._44_4_ = uVar29;
                auVar47._48_4_ = uVar29;
                auVar47._52_4_ = uVar29;
                auVar47._56_4_ = uVar29;
                auVar47._60_4_ = uVar29;
                auVar42 = vfmsub132ps_avx512f(local_a380,local_a2c0,auVar47);
                uVar29 = *(undefined4 *)(root.ptr + 0xa0 + lVar26 * 4);
                auVar48._4_4_ = uVar29;
                auVar48._0_4_ = uVar29;
                auVar48._8_4_ = uVar29;
                auVar48._12_4_ = uVar29;
                auVar48._16_4_ = uVar29;
                auVar48._20_4_ = uVar29;
                auVar48._24_4_ = uVar29;
                auVar48._28_4_ = uVar29;
                auVar48._32_4_ = uVar29;
                auVar48._36_4_ = uVar29;
                auVar48._40_4_ = uVar29;
                auVar48._44_4_ = uVar29;
                auVar48._48_4_ = uVar29;
                auVar48._52_4_ = uVar29;
                auVar48._56_4_ = uVar29;
                auVar48._60_4_ = uVar29;
                auVar43 = vfmsub132ps_avx512f(local_a340,local_a280,auVar48);
                uVar29 = *(undefined4 *)(root.ptr + 0xe0 + lVar26 * 4);
                auVar49._4_4_ = uVar29;
                auVar49._0_4_ = uVar29;
                auVar49._8_4_ = uVar29;
                auVar49._12_4_ = uVar29;
                auVar49._16_4_ = uVar29;
                auVar49._20_4_ = uVar29;
                auVar49._24_4_ = uVar29;
                auVar49._28_4_ = uVar29;
                auVar49._32_4_ = uVar29;
                auVar49._36_4_ = uVar29;
                auVar49._40_4_ = uVar29;
                auVar49._44_4_ = uVar29;
                auVar49._48_4_ = uVar29;
                auVar49._52_4_ = uVar29;
                auVar49._56_4_ = uVar29;
                auVar49._60_4_ = uVar29;
                auVar44 = vfmsub132ps_avx512f(local_a300,local_a240,auVar49);
                auVar45 = vminps_avx512f(auVar39,auVar42);
                auVar46 = vminps_avx512f(auVar40,auVar43);
                auVar45 = vpmaxsd_avx512f(auVar45,auVar46);
                auVar46 = vminps_avx512f(auVar41,auVar44);
                auVar45 = vpmaxsd_avx512f(auVar45,auVar46);
                auVar39 = vmaxps_avx512f(auVar39,auVar42);
                auVar40 = vmaxps_avx512f(auVar40,auVar43);
                auVar39 = vpminsd_avx512f(auVar39,auVar40);
                auVar40 = vmaxps_avx512f(auVar41,auVar44);
                auVar39 = vpminsd_avx512f(auVar39,auVar40);
                auVar50._4_4_ = uStack_a13c;
                auVar50._0_4_ = local_a140;
                auVar50._8_4_ = uStack_a138;
                auVar50._12_4_ = uStack_a134;
                auVar50._16_4_ = uStack_a130;
                auVar50._20_4_ = uStack_a12c;
                auVar50._24_4_ = uStack_a128;
                auVar50._28_4_ = uStack_a124;
                auVar50._32_4_ = uStack_a120;
                auVar50._36_4_ = uStack_a11c;
                auVar50._40_4_ = uStack_a118;
                auVar50._44_4_ = uStack_a114;
                auVar50._48_4_ = uStack_a110;
                auVar50._52_4_ = uStack_a10c;
                auVar50._56_4_ = uStack_a108;
                auVar50._60_4_ = uStack_a104;
                auVar40 = vpmaxsd_avx512f(auVar45,auVar50);
                auVar51._4_4_ = uStack_a0fc;
                auVar51._0_4_ = local_a100;
                auVar51._8_4_ = uStack_a0f8;
                auVar51._12_4_ = uStack_a0f4;
                auVar51._16_4_ = uStack_a0f0;
                auVar51._20_4_ = uStack_a0ec;
                auVar51._24_4_ = uStack_a0e8;
                auVar51._28_4_ = uStack_a0e4;
                auVar51._32_4_ = uStack_a0e0;
                auVar51._36_4_ = uStack_a0dc;
                auVar51._40_4_ = uStack_a0d8;
                auVar51._44_4_ = uStack_a0d4;
                auVar51._48_4_ = uStack_a0d0;
                auVar51._52_4_ = uStack_a0cc;
                auVar51._56_4_ = uStack_a0c8;
                auVar51._60_4_ = uStack_a0c4;
                auVar39 = vpminsd_avx512f(auVar39,auVar51);
                uVar23 = vpcmpd_avx512f(auVar40,auVar39,2);
                uVar21 = uVar33;
                auVar52 = auVar38;
                if ((short)uVar23 != 0) {
                  auVar39 = vblendmps_avx512f(auVar37,auVar45);
                  bVar32 = (bool)((byte)uVar23 & 1);
                  auVar52._0_4_ = (uint)bVar32 * auVar39._0_4_ | (uint)!bVar32 * auVar45._0_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar32 * auVar39._4_4_ | (uint)!bVar32 * auVar45._4_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar32 * auVar39._8_4_ | (uint)!bVar32 * auVar45._8_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 3) & 1);
                  auVar52._12_4_ = (uint)bVar32 * auVar39._12_4_ | (uint)!bVar32 * auVar45._12_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 4) & 1);
                  auVar52._16_4_ = (uint)bVar32 * auVar39._16_4_ | (uint)!bVar32 * auVar45._16_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 5) & 1);
                  auVar52._20_4_ = (uint)bVar32 * auVar39._20_4_ | (uint)!bVar32 * auVar45._20_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 6) & 1);
                  auVar52._24_4_ = (uint)bVar32 * auVar39._24_4_ | (uint)!bVar32 * auVar45._24_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 7) & 1);
                  auVar52._28_4_ = (uint)bVar32 * auVar39._28_4_ | (uint)!bVar32 * auVar45._28_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 8) & 1);
                  auVar52._32_4_ = (uint)bVar32 * auVar39._32_4_ | (uint)!bVar32 * auVar45._32_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 9) & 1);
                  auVar52._36_4_ = (uint)bVar32 * auVar39._36_4_ | (uint)!bVar32 * auVar45._36_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 10) & 1);
                  auVar52._40_4_ = (uint)bVar32 * auVar39._40_4_ | (uint)!bVar32 * auVar45._40_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 0xb) & 1);
                  auVar52._44_4_ = (uint)bVar32 * auVar39._44_4_ | (uint)!bVar32 * auVar45._44_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 0xc) & 1);
                  auVar52._48_4_ = (uint)bVar32 * auVar39._48_4_ | (uint)!bVar32 * auVar45._48_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 0xd) & 1);
                  auVar52._52_4_ = (uint)bVar32 * auVar39._52_4_ | (uint)!bVar32 * auVar45._52_4_;
                  bVar32 = (bool)((byte)(uVar23 >> 0xe) & 1);
                  auVar52._56_4_ = (uint)bVar32 * auVar39._56_4_ | (uint)!bVar32 * auVar45._56_4_;
                  bVar32 = SUB81(uVar23 >> 0xf,0);
                  auVar52._60_4_ = (uint)bVar32 * auVar39._60_4_ | (uint)!bVar32 * auVar45._60_4_;
                  uVar21 = uVar30;
                  if (uVar33 != 8) {
                    *puVar31 = uVar33;
                    puVar31 = puVar31 + 1;
                    *pauVar25 = auVar38;
                    pauVar25 = pauVar25 + 1;
                  }
                }
                auVar38 = auVar52;
                uVar33 = uVar21;
                lVar26 = lVar26 + 1;
              } while (lVar26 != 8);
              iVar34 = 4;
              if (uVar33 == 8) goto LAB_01f5dadb;
              auVar53._4_4_ = uStack_a0fc;
              auVar53._0_4_ = local_a100;
              auVar53._8_4_ = uStack_a0f8;
              auVar53._12_4_ = uStack_a0f4;
              auVar53._16_4_ = uStack_a0f0;
              auVar53._20_4_ = uStack_a0ec;
              auVar53._24_4_ = uStack_a0e8;
              auVar53._28_4_ = uStack_a0e4;
              auVar53._32_4_ = uStack_a0e0;
              auVar53._36_4_ = uStack_a0dc;
              auVar53._40_4_ = uStack_a0d8;
              auVar53._44_4_ = uStack_a0d4;
              auVar53._48_4_ = uStack_a0d0;
              auVar53._52_4_ = uStack_a0cc;
              auVar53._56_4_ = uStack_a0c8;
              auVar53._60_4_ = uStack_a0c4;
              uVar19 = vcmpps_avx512f(auVar38,auVar53,9);
              root.ptr = uVar33;
            } while ((ushort)uVar28 < (ushort)POPCOUNT((int)uVar19));
            *puVar31 = uVar33;
            puVar31 = puVar31 + 1;
            *pauVar25 = auVar38;
            pauVar25 = pauVar25 + 1;
          }
          else {
            do {
              local_a780 = auVar38;
              local_a7e0 = 0;
              for (uVar30 = uVar33; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                local_a7e0 = local_a7e0 + 1;
              }
              bVar32 = occluded1(local_a7c0,local_a7c8,root,local_a7e0,&local_a7e9,ray,
                                 (TravRayK<16,_false> *)&local_a500.field_0,context);
              uVar22 = 1 << ((uint)local_a7e0 & 0x1f);
              if (!bVar32) {
                uVar22 = 0;
              }
              uVar27 = uVar27 | uVar22;
              uVar33 = uVar33 - 1 & uVar33;
              context = local_a7e8;
              auVar38 = local_a780;
            } while (uVar33 != 0);
            if ((short)uVar27 == -1) {
              iVar34 = 3;
            }
            else {
              auVar36 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              bVar32 = (bool)((byte)uVar27 & 1);
              local_a100 = (uint)bVar32 * auVar36._0_4_ | !bVar32 * local_a100;
              bVar32 = (bool)((byte)(uVar27 >> 1) & 1);
              uStack_a0fc = (uint)bVar32 * auVar36._4_4_ | !bVar32 * uStack_a0fc;
              bVar32 = (bool)((byte)(uVar27 >> 2) & 1);
              uStack_a0f8 = (uint)bVar32 * auVar36._8_4_ | !bVar32 * uStack_a0f8;
              bVar32 = (bool)((byte)(uVar27 >> 3) & 1);
              uStack_a0f4 = (uint)bVar32 * auVar36._12_4_ | !bVar32 * uStack_a0f4;
              bVar32 = (bool)((byte)(uVar27 >> 4) & 1);
              uStack_a0f0 = (uint)bVar32 * auVar36._16_4_ | !bVar32 * uStack_a0f0;
              bVar32 = (bool)((byte)(uVar27 >> 5) & 1);
              uStack_a0ec = (uint)bVar32 * auVar36._20_4_ | !bVar32 * uStack_a0ec;
              bVar32 = (bool)((byte)(uVar27 >> 6) & 1);
              uStack_a0e8 = (uint)bVar32 * auVar36._24_4_ | !bVar32 * uStack_a0e8;
              bVar32 = (bool)((byte)(uVar27 >> 7) & 1);
              uStack_a0e4 = (uint)bVar32 * auVar36._28_4_ | !bVar32 * uStack_a0e4;
              bVar32 = (bool)((byte)(uVar27 >> 8) & 1);
              uStack_a0e0 = (uint)bVar32 * auVar36._32_4_ | !bVar32 * uStack_a0e0;
              bVar32 = (bool)((byte)(uVar27 >> 9) & 1);
              uStack_a0dc = (uint)bVar32 * auVar36._36_4_ | !bVar32 * uStack_a0dc;
              bVar32 = (bool)((byte)(uVar27 >> 10) & 1);
              uStack_a0d8 = (uint)bVar32 * auVar36._40_4_ | !bVar32 * uStack_a0d8;
              bVar32 = (bool)((byte)(uVar27 >> 0xb) & 1);
              uStack_a0d4 = (uint)bVar32 * auVar36._44_4_ | !bVar32 * uStack_a0d4;
              bVar32 = (bool)((byte)(uVar27 >> 0xc) & 1);
              uStack_a0d0 = (uint)bVar32 * auVar36._48_4_ | !bVar32 * uStack_a0d0;
              bVar32 = (bool)((byte)(uVar27 >> 0xd) & 1);
              uStack_a0cc = (uint)bVar32 * auVar36._52_4_ | !bVar32 * uStack_a0cc;
              bVar32 = (bool)((byte)(uVar27 >> 0xe) & 1);
              uStack_a0c8 = (uint)bVar32 * auVar36._56_4_ | !bVar32 * uStack_a0c8;
              bVar32 = (bool)((byte)(uVar27 >> 0xf) & 1);
              uStack_a0c4 = (uint)bVar32 * auVar36._60_4_ | !bVar32 * uStack_a0c4;
              iVar34 = 2;
            }
            auVar37 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            auVar36 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
            auVar35 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
            auVar71 = ZEXT1664(auVar35);
            if (uVar28 < (uint)POPCOUNT(uVar29)) goto LAB_01f5d961;
          }
LAB_01f5dadb:
        } while ((iVar34 == 4) || (iVar34 == 2));
LAB_01f5e1ab:
        uVar27 = uVar27 & local_a7d8;
        auVar36 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        bVar32 = (bool)((byte)uVar27 & 1);
        bVar3 = (bool)((byte)(uVar27 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar27 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar27 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar27 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar27 >> 7) & 1);
        bVar11 = (bool)((byte)(uVar27 >> 8) & 1);
        bVar12 = (bool)((byte)(uVar27 >> 9) & 1);
        bVar13 = (bool)((byte)(uVar27 >> 10) & 1);
        bVar14 = (bool)((byte)(uVar27 >> 0xb) & 1);
        bVar15 = (bool)((byte)(uVar27 >> 0xc) & 1);
        bVar16 = (bool)((byte)(uVar27 >> 0xd) & 1);
        bVar17 = (bool)((byte)(uVar27 >> 0xe) & 1);
        bVar18 = (bool)((byte)(uVar27 >> 0xf) & 1);
        *(uint *)local_a7d0 = (uint)bVar32 * auVar36._0_4_ | (uint)!bVar32 * *(int *)local_a7d0;
        *(uint *)(local_a7d0 + 4) =
             (uint)bVar3 * auVar36._4_4_ | (uint)!bVar3 * *(int *)(local_a7d0 + 4);
        *(uint *)(local_a7d0 + 8) =
             (uint)bVar4 * auVar36._8_4_ | (uint)!bVar4 * *(int *)(local_a7d0 + 8);
        *(uint *)(local_a7d0 + 0xc) =
             (uint)bVar5 * auVar36._12_4_ | (uint)!bVar5 * *(int *)(local_a7d0 + 0xc);
        *(uint *)(local_a7d0 + 0x10) =
             (uint)bVar6 * auVar36._16_4_ | (uint)!bVar6 * *(int *)(local_a7d0 + 0x10);
        *(uint *)(local_a7d0 + 0x14) =
             (uint)bVar7 * auVar36._20_4_ | (uint)!bVar7 * *(int *)(local_a7d0 + 0x14);
        *(uint *)(local_a7d0 + 0x18) =
             (uint)bVar8 * auVar36._24_4_ | (uint)!bVar8 * *(int *)(local_a7d0 + 0x18);
        *(uint *)(local_a7d0 + 0x1c) =
             (uint)bVar9 * auVar36._28_4_ | (uint)!bVar9 * *(int *)(local_a7d0 + 0x1c);
        *(uint *)(local_a7d0 + 0x20) =
             (uint)bVar11 * auVar36._32_4_ | (uint)!bVar11 * *(int *)(local_a7d0 + 0x20);
        *(uint *)(local_a7d0 + 0x24) =
             (uint)bVar12 * auVar36._36_4_ | (uint)!bVar12 * *(int *)(local_a7d0 + 0x24);
        *(uint *)(local_a7d0 + 0x28) =
             (uint)bVar13 * auVar36._40_4_ | (uint)!bVar13 * *(int *)(local_a7d0 + 0x28);
        *(uint *)(local_a7d0 + 0x2c) =
             (uint)bVar14 * auVar36._44_4_ | (uint)!bVar14 * *(int *)(local_a7d0 + 0x2c);
        *(uint *)(local_a7d0 + 0x30) =
             (uint)bVar15 * auVar36._48_4_ | (uint)!bVar15 * *(int *)(local_a7d0 + 0x30);
        *(uint *)(local_a7d0 + 0x34) =
             (uint)bVar16 * auVar36._52_4_ | (uint)!bVar16 * *(int *)(local_a7d0 + 0x34);
        *(uint *)(local_a7d0 + 0x38) =
             (uint)bVar17 * auVar36._56_4_ | (uint)!bVar17 * *(int *)(local_a7d0 + 0x38);
        *(uint *)(local_a7d0 + 0x3c) =
             (uint)bVar18 * auVar36._60_4_ | (uint)!bVar18 * *(int *)(local_a7d0 + 0x3c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar33 = uVar33 + 1;
    lVar26 = lVar26 + 0xb0;
    if (local_a7b8 <= uVar33) break;
LAB_01f5db36:
    local_a780._0_8_ = uVar33;
    uVar30 = 0;
    local_a7d4 = uVar22;
    while (uVar23 = (ulong)*(uint *)(lVar26 + -0x10 + uVar30 * 4), uVar23 != 0xffffffff) {
      auVar38 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0xa0 + uVar30 * 4)));
      auVar39 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0x90 + uVar30 * 4)));
      auVar40 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0x80 + uVar30 * 4)));
      auVar44 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0x70 + uVar30 * 4)));
      auVar45 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0x60 + uVar30 * 4)));
      auVar46 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0x50 + uVar30 * 4)));
      auVar47 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0x40 + uVar30 * 4)));
      auVar48 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0x30 + uVar30 * 4)));
      auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar26 + -0x20 + uVar30 * 4)));
      auVar35 = vmulss_avx512f(auVar45._0_16_,auVar49._0_16_);
      auVar41 = vbroadcastss_avx512f(auVar35);
      auVar43 = vfmsub231ps_avx512f(auVar41,auVar48,auVar46);
      auVar41 = vbroadcastss_avx512f(ZEXT416((uint)(auVar46._0_4_ * auVar47._0_4_)));
      auVar42 = vfmsub231ps_avx512f(auVar41,auVar49,auVar44);
      auVar41 = vbroadcastss_avx512f(ZEXT416((uint)(auVar48._0_4_ * auVar44._0_4_)));
      auVar50 = vsubps_avx512f(auVar38,*(undefined1 (*) [64])ray);
      auVar51 = vsubps_avx512f(auVar39,*(undefined1 (*) [64])(ray + 0x40));
      auVar52 = vsubps_avx512f(auVar40,*(undefined1 (*) [64])(ray + 0x80));
      auVar38 = *(undefined1 (*) [64])(ray + 0x100);
      auVar39 = *(undefined1 (*) [64])(ray + 0x140);
      auVar40 = *(undefined1 (*) [64])(ray + 0x180);
      auVar41 = vfmsub231ps_avx512f(auVar41,auVar47,auVar45);
      auVar53 = vmulps_avx512f(auVar39,auVar52);
      auVar53 = vfmsub231ps_avx512f(auVar53,auVar51,auVar40);
      auVar54 = vmulps_avx512f(auVar40,auVar50);
      auVar54 = vfmsub231ps_avx512f(auVar54,auVar52,auVar38);
      auVar55 = vmulps_avx512f(auVar38,auVar51);
      auVar55 = vfmsub231ps_avx512f(auVar55,auVar50,auVar39);
      auVar40 = vmulps_avx512f(auVar41,auVar40);
      auVar39 = vfmadd231ps_avx512f(auVar40,auVar42,auVar39);
      auVar39 = vfmadd231ps_avx512f(auVar39,auVar43,auVar38);
      auVar40 = vandps_avx512dq(auVar39,auVar36);
      auVar38 = vmulps_avx512f(auVar49,auVar55);
      auVar38 = vfmadd231ps_avx512f(auVar38,auVar54,auVar48);
      auVar38 = vfmadd231ps_avx512f(auVar38,auVar53,auVar47);
      auVar38 = vxorps_avx512dq(auVar40,auVar38);
      uVar19 = vcmpps_avx512f(auVar38,auVar71,5);
      uVar24 = (ushort)uVar19 & (ushort)uVar22;
      local_a7e0 = CONCAT44(local_a7e0._4_4_,uVar22);
      if (uVar24 == 0) {
LAB_01f5dc69:
        uVar24 = 0;
      }
      else {
        auVar46 = vmulps_avx512f(auVar46,auVar55);
        auVar45 = vfmadd213ps_avx512f(auVar54,auVar45,auVar46);
        auVar44 = vfmadd213ps_avx512f(auVar53,auVar44,auVar45);
        auVar44 = vxorps_avx512dq(auVar40,auVar44);
        uVar19 = vcmpps_avx512f(auVar44,auVar71,5);
        uVar24 = uVar24 & (ushort)uVar19;
        if (uVar24 == 0) goto LAB_01f5dc69;
        auVar45._8_4_ = 0x7fffffff;
        auVar45._0_8_ = 0x7fffffff7fffffff;
        auVar45._12_4_ = 0x7fffffff;
        auVar45._16_4_ = 0x7fffffff;
        auVar45._20_4_ = 0x7fffffff;
        auVar45._24_4_ = 0x7fffffff;
        auVar45._28_4_ = 0x7fffffff;
        auVar45._32_4_ = 0x7fffffff;
        auVar45._36_4_ = 0x7fffffff;
        auVar45._40_4_ = 0x7fffffff;
        auVar45._44_4_ = 0x7fffffff;
        auVar45._48_4_ = 0x7fffffff;
        auVar45._52_4_ = 0x7fffffff;
        auVar45._56_4_ = 0x7fffffff;
        auVar45._60_4_ = 0x7fffffff;
        auVar45 = vandpd_avx512dq(auVar39,auVar45);
        auVar46 = vsubps_avx512f(auVar45,auVar38);
        uVar19 = vcmpps_avx512f(auVar46,auVar44,5);
        uVar24 = uVar24 & (ushort)uVar19;
        if (uVar24 == 0) goto LAB_01f5dc69;
        auVar36 = vmulps_avx512f(auVar41,auVar52);
        auVar36 = vfmadd213ps_avx512f(auVar51,auVar42,auVar36);
        auVar36 = vfmadd213ps_avx512f(auVar50,auVar43,auVar36);
        auVar36 = vxorps_avx512dq(auVar40,auVar36);
        auVar37 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])(ray + 0xc0));
        auVar40 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])(ray + 0x200));
        uVar19 = vcmpps_avx512f(auVar36,auVar40,2);
        uVar20 = vcmpps_avx512f(auVar37,auVar36,1);
        uVar24 = uVar24 & (ushort)uVar19 & (ushort)uVar20;
        if (uVar24 == 0) {
LAB_01f5e06a:
          uVar24 = 0;
          auVar41 = local_a6c0;
          auVar42 = local_a680;
          auVar43 = local_a640;
          auVar45 = local_a600;
          auVar36 = local_a5c0;
          auVar44 = local_a580;
          auVar38 = local_a540;
        }
        else {
          uVar19 = vcmpps_avx512f(auVar39,ZEXT1664(ZEXT816(0) << 0x40),4);
          uVar24 = uVar24 & (ushort)uVar19;
          if (uVar24 == 0) goto LAB_01f5e06a;
        }
        local_a540 = auVar38;
        local_a580 = auVar44;
        local_a5c0 = auVar36;
        local_a600 = auVar45;
        local_a640 = auVar43;
        local_a680 = auVar42;
        local_a6c0 = auVar41;
        auVar37 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        auVar36 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
        auVar35 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
        auVar71 = ZEXT1664(auVar35);
        context = local_a7e8;
      }
      auVar35 = auVar71._0_16_;
      pGVar1 = (context->scene->geometries).items[uVar23].ptr;
      auVar38 = vpbroadcastd_avx512f(ZEXT416(pGVar1->mask));
      uVar19 = vptestmd_avx512f(auVar38,*(undefined1 (*) [64])(ray + 0x240));
      uVar24 = (ushort)uVar19 & uVar24;
      if (uVar24 == 0) {
      }
      else {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar38 = vrcp14ps_avx512f(local_a600);
          auVar46._8_4_ = 0x3f800000;
          auVar46._0_8_ = 0x3f8000003f800000;
          auVar46._12_4_ = 0x3f800000;
          auVar46._16_4_ = 0x3f800000;
          auVar46._20_4_ = 0x3f800000;
          auVar46._24_4_ = 0x3f800000;
          auVar46._28_4_ = 0x3f800000;
          auVar46._32_4_ = 0x3f800000;
          auVar46._36_4_ = 0x3f800000;
          auVar46._40_4_ = 0x3f800000;
          auVar46._44_4_ = 0x3f800000;
          auVar46._48_4_ = 0x3f800000;
          auVar46._52_4_ = 0x3f800000;
          auVar46._56_4_ = 0x3f800000;
          auVar46._60_4_ = 0x3f800000;
          auVar39 = vfnmadd213ps_avx512f(auVar38,local_a600,auVar46);
          auVar38 = vfmadd132ps_avx512f(auVar39,auVar38,auVar38);
          local_a000 = vmulps_avx512f(auVar38,local_a540);
          local_9fc0 = vmulps_avx512f(auVar38,local_a580);
          auVar39 = vpbroadcastd_avx512f();
          auVar40 = vpbroadcastd_avx512f();
          local_a0c0 = local_a640._0_8_;
          uStack_a0b8 = local_a640._8_8_;
          uStack_a0b0 = local_a640._16_8_;
          uStack_a0a8 = local_a640._24_8_;
          uStack_a0a0 = local_a640._32_8_;
          uStack_a098 = local_a640._40_8_;
          uStack_a090 = local_a640._48_8_;
          uStack_a088 = local_a640._56_8_;
          local_a080 = local_a680._0_8_;
          uStack_a078 = local_a680._8_8_;
          uStack_a070 = local_a680._16_8_;
          uStack_a068 = local_a680._24_8_;
          uStack_a060 = local_a680._32_8_;
          uStack_a058 = local_a680._40_8_;
          uStack_a050 = local_a680._48_8_;
          uStack_a048 = local_a680._56_8_;
          local_a040 = local_a6c0._0_8_;
          uStack_a038 = local_a6c0._8_8_;
          uStack_a030 = local_a6c0._16_8_;
          uStack_a028 = local_a6c0._24_8_;
          uStack_a020 = local_a6c0._32_8_;
          uStack_a018 = local_a6c0._40_8_;
          uStack_a010 = local_a6c0._48_8_;
          uStack_a008 = local_a6c0._56_8_;
          local_9f80 = vmovdqa64_avx512f(auVar40);
          local_9f40 = vmovdqa64_avx512f(auVar39);
          vpcmpeqd_avx2(local_a000._0_32_,local_a000._0_32_);
          local_9f00 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
          local_9ec0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
          local_a700 = *(int *)(ray + 0x200);
          iStack_a6fc = *(int *)(ray + 0x204);
          iStack_a6f8 = *(int *)(ray + 0x208);
          iStack_a6f4 = *(int *)(ray + 0x20c);
          iStack_a6f0 = *(int *)(ray + 0x210);
          iStack_a6ec = *(int *)(ray + 0x214);
          iStack_a6e8 = *(int *)(ray + 0x218);
          iStack_a6e4 = *(int *)(ray + 0x21c);
          iStack_a6e0 = *(int *)(ray + 0x220);
          iStack_a6dc = *(int *)(ray + 0x224);
          iStack_a6d8 = *(int *)(ray + 0x228);
          iStack_a6d4 = *(int *)(ray + 0x22c);
          iStack_a6d0 = *(int *)(ray + 0x230);
          iStack_a6cc = *(int *)(ray + 0x234);
          iStack_a6c8 = *(int *)(ray + 0x238);
          iStack_a6c4 = *(int *)(ray + 0x23c);
          auVar38 = vmulps_avx512f(auVar38,local_a5c0);
          bVar32 = (bool)((byte)uVar24 & 1);
          bVar3 = (bool)((byte)(uVar24 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar24 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar24 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar24 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar24 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar24 >> 7) & 1);
          bVar10 = (byte)(uVar24 >> 8);
          bVar11 = (bool)(bVar10 >> 1 & 1);
          bVar12 = (bool)(bVar10 >> 2 & 1);
          bVar13 = (bool)(bVar10 >> 3 & 1);
          bVar14 = (bool)(bVar10 >> 4 & 1);
          bVar15 = (bool)(bVar10 >> 5 & 1);
          bVar16 = (bool)(bVar10 >> 6 & 1);
          *(uint *)(ray + 0x200) = (uint)bVar32 * auVar38._0_4_ | (uint)!bVar32 * local_a700;
          *(uint *)(ray + 0x204) = (uint)bVar3 * auVar38._4_4_ | (uint)!bVar3 * iStack_a6fc;
          *(uint *)(ray + 0x208) = (uint)bVar4 * auVar38._8_4_ | (uint)!bVar4 * iStack_a6f8;
          *(uint *)(ray + 0x20c) = (uint)bVar5 * auVar38._12_4_ | (uint)!bVar5 * iStack_a6f4;
          *(uint *)(ray + 0x210) = (uint)bVar6 * auVar38._16_4_ | (uint)!bVar6 * iStack_a6f0;
          *(uint *)(ray + 0x214) = (uint)bVar7 * auVar38._20_4_ | (uint)!bVar7 * iStack_a6ec;
          *(uint *)(ray + 0x218) = (uint)bVar8 * auVar38._24_4_ | (uint)!bVar8 * iStack_a6e8;
          *(uint *)(ray + 0x21c) = (uint)bVar9 * auVar38._28_4_ | (uint)!bVar9 * iStack_a6e4;
          *(uint *)(ray + 0x220) =
               (uint)(bVar10 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_a6e0;
          *(uint *)(ray + 0x224) = (uint)bVar11 * auVar38._36_4_ | (uint)!bVar11 * iStack_a6dc;
          *(uint *)(ray + 0x228) = (uint)bVar12 * auVar38._40_4_ | (uint)!bVar12 * iStack_a6d8;
          *(uint *)(ray + 0x22c) = (uint)bVar13 * auVar38._44_4_ | (uint)!bVar13 * iStack_a6d4;
          *(uint *)(ray + 0x230) = (uint)bVar14 * auVar38._48_4_ | (uint)!bVar14 * iStack_a6d0;
          *(uint *)(ray + 0x234) = (uint)bVar15 * auVar38._52_4_ | (uint)!bVar15 * iStack_a6cc;
          *(uint *)(ray + 0x238) = (uint)bVar16 * auVar38._56_4_ | (uint)!bVar16 * iStack_a6c8;
          *(uint *)(ray + 0x23c) =
               (uint)(bVar10 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_a6c4;
          auVar38 = vpmovm2d_avx512dq((ulong)uVar24);
          local_a740 = vmovdqa64_avx512f(auVar38);
          local_a7b0.valid = (int *)local_a740;
          local_a7b0.geometryUserPtr = pGVar1->userPtr;
          local_a7b0.context = context->user;
          local_a7b0.hit = (RTCHitN *)&local_a0c0;
          local_a7b0.N = 0x10;
          local_a7b0.ray = (RTCRayN *)ray;
          if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar1->occlusionFilterN)(&local_a7b0);
            auVar35 = vxorps_avx512vl(auVar35,auVar35);
            auVar71 = ZEXT1664(auVar35);
            auVar36 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
            auVar37 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            auVar38 = vmovdqa64_avx512f(local_a740);
            context = local_a7e8;
          }
          auVar35 = auVar71._0_16_;
          uVar19 = vptestmd_avx512f(auVar38,auVar38);
          if ((short)uVar19 == 0) {
            uVar33 = 0;
          }
          else {
            p_Var2 = context->args->filter;
            if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var2)(&local_a7b0);
              auVar35 = vxorps_avx512vl(auVar35,auVar35);
              auVar71 = ZEXT1664(auVar35);
              auVar36 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
              auVar37 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              auVar38 = vmovdqa64_avx512f(local_a740);
              context = local_a7e8;
            }
            uVar33 = vptestmd_avx512f(auVar38,auVar38);
            auVar38 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar32 = (bool)((byte)uVar33 & 1);
            bVar3 = (bool)((byte)(uVar33 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar33 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar33 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar33 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar33 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar33 >> 6) & 1);
            bVar9 = (bool)((byte)(uVar33 >> 7) & 1);
            bVar11 = (bool)((byte)(uVar33 >> 8) & 1);
            bVar12 = (bool)((byte)(uVar33 >> 9) & 1);
            bVar13 = (bool)((byte)(uVar33 >> 10) & 1);
            bVar14 = (bool)((byte)(uVar33 >> 0xb) & 1);
            bVar15 = (bool)((byte)(uVar33 >> 0xc) & 1);
            bVar16 = (bool)((byte)(uVar33 >> 0xd) & 1);
            bVar17 = (bool)((byte)(uVar33 >> 0xe) & 1);
            bVar18 = SUB81(uVar33 >> 0xf,0);
            *(uint *)(local_a7b0.ray + 0x200) =
                 (uint)bVar32 * auVar38._0_4_ | (uint)!bVar32 * *(int *)(local_a7b0.ray + 0x200);
            *(uint *)(local_a7b0.ray + 0x204) =
                 (uint)bVar3 * auVar38._4_4_ | (uint)!bVar3 * *(int *)(local_a7b0.ray + 0x204);
            *(uint *)(local_a7b0.ray + 0x208) =
                 (uint)bVar4 * auVar38._8_4_ | (uint)!bVar4 * *(int *)(local_a7b0.ray + 0x208);
            *(uint *)(local_a7b0.ray + 0x20c) =
                 (uint)bVar5 * auVar38._12_4_ | (uint)!bVar5 * *(int *)(local_a7b0.ray + 0x20c);
            *(uint *)(local_a7b0.ray + 0x210) =
                 (uint)bVar6 * auVar38._16_4_ | (uint)!bVar6 * *(int *)(local_a7b0.ray + 0x210);
            *(uint *)(local_a7b0.ray + 0x214) =
                 (uint)bVar7 * auVar38._20_4_ | (uint)!bVar7 * *(int *)(local_a7b0.ray + 0x214);
            *(uint *)(local_a7b0.ray + 0x218) =
                 (uint)bVar8 * auVar38._24_4_ | (uint)!bVar8 * *(int *)(local_a7b0.ray + 0x218);
            *(uint *)(local_a7b0.ray + 0x21c) =
                 (uint)bVar9 * auVar38._28_4_ | (uint)!bVar9 * *(int *)(local_a7b0.ray + 0x21c);
            *(uint *)(local_a7b0.ray + 0x220) =
                 (uint)bVar11 * auVar38._32_4_ | (uint)!bVar11 * *(int *)(local_a7b0.ray + 0x220);
            *(uint *)(local_a7b0.ray + 0x224) =
                 (uint)bVar12 * auVar38._36_4_ | (uint)!bVar12 * *(int *)(local_a7b0.ray + 0x224);
            *(uint *)(local_a7b0.ray + 0x228) =
                 (uint)bVar13 * auVar38._40_4_ | (uint)!bVar13 * *(int *)(local_a7b0.ray + 0x228);
            *(uint *)(local_a7b0.ray + 0x22c) =
                 (uint)bVar14 * auVar38._44_4_ | (uint)!bVar14 * *(int *)(local_a7b0.ray + 0x22c);
            *(uint *)(local_a7b0.ray + 0x230) =
                 (uint)bVar15 * auVar38._48_4_ | (uint)!bVar15 * *(int *)(local_a7b0.ray + 0x230);
            *(uint *)(local_a7b0.ray + 0x234) =
                 (uint)bVar16 * auVar38._52_4_ | (uint)!bVar16 * *(int *)(local_a7b0.ray + 0x234);
            *(uint *)(local_a7b0.ray + 0x238) =
                 (uint)bVar17 * auVar38._56_4_ | (uint)!bVar17 * *(int *)(local_a7b0.ray + 0x238);
            *(uint *)(local_a7b0.ray + 0x23c) =
                 (uint)bVar18 * auVar38._60_4_ | (uint)!bVar18 * *(int *)(local_a7b0.ray + 0x23c);
          }
          uVar24 = (ushort)uVar33;
          bVar32 = (bool)((byte)uVar33 & 1);
          bVar3 = (bool)((byte)(uVar33 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar33 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar33 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar33 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar33 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar33 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar33 >> 7) & 1);
          bVar11 = (bool)((byte)(uVar33 >> 8) & 1);
          bVar12 = (bool)((byte)(uVar33 >> 9) & 1);
          bVar13 = (bool)((byte)(uVar33 >> 10) & 1);
          bVar14 = (bool)((byte)(uVar33 >> 0xb) & 1);
          bVar15 = (bool)((byte)(uVar33 >> 0xc) & 1);
          bVar16 = (bool)((byte)(uVar33 >> 0xd) & 1);
          bVar17 = (bool)((byte)(uVar33 >> 0xe) & 1);
          bVar18 = SUB81(uVar33 >> 0xf,0);
          *(uint *)local_a7d0 = (uint)bVar32 * *(int *)local_a7d0 | (uint)!bVar32 * local_a700;
          *(uint *)(local_a7d0 + 4) =
               (uint)bVar3 * *(int *)(local_a7d0 + 4) | (uint)!bVar3 * iStack_a6fc;
          *(uint *)(local_a7d0 + 8) =
               (uint)bVar4 * *(int *)(local_a7d0 + 8) | (uint)!bVar4 * iStack_a6f8;
          *(uint *)(local_a7d0 + 0xc) =
               (uint)bVar5 * *(int *)(local_a7d0 + 0xc) | (uint)!bVar5 * iStack_a6f4;
          *(uint *)(local_a7d0 + 0x10) =
               (uint)bVar6 * *(int *)(local_a7d0 + 0x10) | (uint)!bVar6 * iStack_a6f0;
          *(uint *)(local_a7d0 + 0x14) =
               (uint)bVar7 * *(int *)(local_a7d0 + 0x14) | (uint)!bVar7 * iStack_a6ec;
          *(uint *)(local_a7d0 + 0x18) =
               (uint)bVar8 * *(int *)(local_a7d0 + 0x18) | (uint)!bVar8 * iStack_a6e8;
          *(uint *)(local_a7d0 + 0x1c) =
               (uint)bVar9 * *(int *)(local_a7d0 + 0x1c) | (uint)!bVar9 * iStack_a6e4;
          *(uint *)(local_a7d0 + 0x20) =
               (uint)bVar11 * *(int *)(local_a7d0 + 0x20) | (uint)!bVar11 * iStack_a6e0;
          *(uint *)(local_a7d0 + 0x24) =
               (uint)bVar12 * *(int *)(local_a7d0 + 0x24) | (uint)!bVar12 * iStack_a6dc;
          *(uint *)(local_a7d0 + 0x28) =
               (uint)bVar13 * *(int *)(local_a7d0 + 0x28) | (uint)!bVar13 * iStack_a6d8;
          *(uint *)(local_a7d0 + 0x2c) =
               (uint)bVar14 * *(int *)(local_a7d0 + 0x2c) | (uint)!bVar14 * iStack_a6d4;
          *(uint *)(local_a7d0 + 0x30) =
               (uint)bVar15 * *(int *)(local_a7d0 + 0x30) | (uint)!bVar15 * iStack_a6d0;
          *(uint *)(local_a7d0 + 0x34) =
               (uint)bVar16 * *(int *)(local_a7d0 + 0x34) | (uint)!bVar16 * iStack_a6cc;
          *(uint *)(local_a7d0 + 0x38) =
               (uint)bVar17 * *(int *)(local_a7d0 + 0x38) | (uint)!bVar17 * iStack_a6c8;
          *(uint *)(local_a7d0 + 0x3c) =
               (uint)bVar18 * *(int *)(local_a7d0 + 0x3c) | (uint)!bVar18 * iStack_a6c4;
        }
        uVar22 = (uint)local_a7e0 & (ushort)~uVar24;
      }
      uVar33 = local_a780._0_8_;
      if (((short)uVar22 == 0) || (bVar32 = 2 < uVar30, uVar30 = uVar30 + 1, bVar32)) break;
    }
    uVar24 = (ushort)local_a7d4 & (ushort)uVar22;
    uVar22 = CONCAT22((short)(local_a7d4 >> 0x10),uVar24);
    if (uVar24 == 0) break;
  }
  uVar22 = ~uVar22;
LAB_01f5e094:
  uVar27 = uVar27 | uVar22;
  if ((short)uVar27 == -1) {
    uVar27 = 0xffff;
    goto LAB_01f5e1ab;
  }
  auVar38 = vbroadcastss_avx512f(ZEXT416(0xff800000));
  bVar32 = (bool)((byte)uVar27 & 1);
  local_a100 = (uint)bVar32 * auVar38._0_4_ | !bVar32 * local_a100;
  bVar32 = (bool)((byte)(uVar27 >> 1) & 1);
  uStack_a0fc = (uint)bVar32 * auVar38._4_4_ | !bVar32 * uStack_a0fc;
  bVar32 = (bool)((byte)(uVar27 >> 2) & 1);
  uStack_a0f8 = (uint)bVar32 * auVar38._8_4_ | !bVar32 * uStack_a0f8;
  bVar32 = (bool)((byte)(uVar27 >> 3) & 1);
  uStack_a0f4 = (uint)bVar32 * auVar38._12_4_ | !bVar32 * uStack_a0f4;
  bVar32 = (bool)((byte)(uVar27 >> 4) & 1);
  uStack_a0f0 = (uint)bVar32 * auVar38._16_4_ | !bVar32 * uStack_a0f0;
  bVar32 = (bool)((byte)(uVar27 >> 5) & 1);
  uStack_a0ec = (uint)bVar32 * auVar38._20_4_ | !bVar32 * uStack_a0ec;
  bVar32 = (bool)((byte)(uVar27 >> 6) & 1);
  uStack_a0e8 = (uint)bVar32 * auVar38._24_4_ | !bVar32 * uStack_a0e8;
  bVar32 = (bool)((byte)(uVar27 >> 7) & 1);
  uStack_a0e4 = (uint)bVar32 * auVar38._28_4_ | !bVar32 * uStack_a0e4;
  bVar32 = (bool)((byte)(uVar27 >> 8) & 1);
  uStack_a0e0 = (uint)bVar32 * auVar38._32_4_ | !bVar32 * uStack_a0e0;
  bVar32 = (bool)((byte)(uVar27 >> 9) & 1);
  uStack_a0dc = (uint)bVar32 * auVar38._36_4_ | !bVar32 * uStack_a0dc;
  bVar32 = (bool)((byte)(uVar27 >> 10) & 1);
  uStack_a0d8 = (uint)bVar32 * auVar38._40_4_ | !bVar32 * uStack_a0d8;
  bVar32 = (bool)((byte)(uVar27 >> 0xb) & 1);
  uStack_a0d4 = (uint)bVar32 * auVar38._44_4_ | !bVar32 * uStack_a0d4;
  bVar32 = (bool)((byte)(uVar27 >> 0xc) & 1);
  uStack_a0d0 = (uint)bVar32 * auVar38._48_4_ | !bVar32 * uStack_a0d0;
  bVar32 = (bool)((byte)(uVar27 >> 0xd) & 1);
  uStack_a0cc = (uint)bVar32 * auVar38._52_4_ | !bVar32 * uStack_a0cc;
  bVar32 = (bool)((byte)(uVar27 >> 0xe) & 1);
  uStack_a0c8 = (uint)bVar32 * auVar38._56_4_ | !bVar32 * uStack_a0c8;
  bVar32 = (bool)((byte)(uVar27 >> 0xf) & 1);
  uStack_a0c4 = (uint)bVar32 * auVar38._60_4_ | !bVar32 * uStack_a0c4;
  goto LAB_01f5d91d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }